

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

ExprP<float> __thiscall
vkt::shaderexecutor::Functions::Determinant<2>::doExpand
          (Determinant<2> *this,ExpandContext *param_1,ArgExprs *args)

{
  deInt32 *pdVar1;
  long *plVar2;
  int *piVar3;
  undefined8 *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  SharedPtrStateBase *extraout_RDX_01;
  SharedPtrStateBase *extraout_RDX_02;
  SharedPtrStateBase *extraout_RDX_03;
  SharedPtrStateBase *extraout_RDX_04;
  SharedPtrStateBase *extraout_RDX_05;
  SharedPtrStateBase *extraout_RDX_06;
  SharedPtrStateBase *extraout_RDX_07;
  SharedPtrStateBase *extraout_RDX_08;
  SharedPtrStateBase *extraout_RDX_09;
  SharedPtrStateBase *extraout_RDX_10;
  SharedPtrStateBase *extraout_RDX_11;
  SharedPtrStateBase *extraout_RDX_12;
  SharedPtrStateBase *extraout_RDX_13;
  SharedPtrStateBase *extraout_RDX_14;
  SharedPtrStateBase *extraout_RDX_15;
  SharedPtrStateBase *extraout_RDX_16;
  SharedPtrStateBase *extraout_RDX_17;
  SharedPtrStateBase *extraout_RDX_18;
  SharedPtrStateBase *extraout_RDX_19;
  SharedPtrStateBase *extraout_RDX_20;
  int i;
  ExprP<float> EVar5;
  ExprP<tcu::Matrix<float,_2,_2>_> mat;
  undefined8 local_b8;
  long *local_b0;
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_> local_a8;
  ExprP<float> local_98;
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_> local_88;
  ExprP<float> local_78;
  ExprP<float> local_68;
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_> local_58;
  ExprP<float> local_48;
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_> local_38;
  ExprP<float> local_28;
  ExprP<float> local_18;
  SharedPtrStateBase *pSVar4;
  
  local_b8 = *in_RCX;
  local_b0 = (long *)in_RCX[1];
  if (local_b0 != (long *)0x0) {
    LOCK();
    *(int *)(local_b0 + 1) = (int)local_b0[1] + 1;
    UNLOCK();
    LOCK();
    *(int *)((long)local_b0 + 0xc) = *(int *)((long)local_b0 + 0xc) + 1;
    UNLOCK();
  }
  i = (int)&local_b8;
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[](&local_38,i);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_28,(int)&local_38);
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[](&local_58,i);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_48,(int)&local_58);
  shaderexecutor::operator*((shaderexecutor *)&local_18,&local_28,&local_48);
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[](&local_88,i);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_78,(int)&local_88);
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[](&local_a8,i);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_98,(int)&local_a8);
  shaderexecutor::operator*((shaderexecutor *)&local_68,&local_78,&local_98);
  EVar5 = shaderexecutor::operator-((shaderexecutor *)this,&local_18,&local_68);
  pSVar4 = EVar5.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
           m_state;
  if (local_68.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_68.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_68.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr
           = (Expr<float> *)0x0;
      (*(local_68.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
      pSVar4 = extraout_RDX;
    }
    LOCK();
    pdVar1 = &(local_68.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_68.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state != (SharedPtrStateBase *)0x0) {
        (*(local_68.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state)->_vptr_SharedPtrStateBase[1])();
        pSVar4 = extraout_RDX_00;
      }
      local_68.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_98.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_98.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_98.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr
           = (Expr<float> *)0x0;
      (*(local_98.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
      pSVar4 = extraout_RDX_01;
    }
    LOCK();
    pdVar1 = &(local_98.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_98.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state != (SharedPtrStateBase *)0x0) {
        (*(local_98.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state)->_vptr_SharedPtrStateBase[1])();
        pSVar4 = extraout_RDX_02;
      }
      local_98.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_a8.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_a8.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)
              ->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_a8.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_ptr =
           (Expr<tcu::Matrix<float,_2,_2>_> *)0x0;
      (*(local_a8.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
      pSVar4 = extraout_RDX_03;
    }
    LOCK();
    pdVar1 = &(local_a8.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)
              ->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_a8.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
          super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state !=
          (SharedPtrStateBase *)0x0) {
        (*(local_a8.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)->
          _vptr_SharedPtrStateBase[1])();
        pSVar4 = extraout_RDX_04;
      }
      local_a8.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state =
           (SharedPtrStateBase *)0x0;
    }
  }
  if (local_78.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_78.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_78.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr
           = (Expr<float> *)0x0;
      (*(local_78.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
      pSVar4 = extraout_RDX_05;
    }
    LOCK();
    pdVar1 = &(local_78.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_78.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state != (SharedPtrStateBase *)0x0) {
        (*(local_78.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state)->_vptr_SharedPtrStateBase[1])();
        pSVar4 = extraout_RDX_06;
      }
      local_78.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_88.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_88.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)
              ->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_88.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_ptr =
           (Expr<tcu::Matrix<float,_2,_2>_> *)0x0;
      (*(local_88.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
      pSVar4 = extraout_RDX_07;
    }
    LOCK();
    pdVar1 = &(local_88.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)
              ->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_88.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
          super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state !=
          (SharedPtrStateBase *)0x0) {
        (*(local_88.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)->
          _vptr_SharedPtrStateBase[1])();
        pSVar4 = extraout_RDX_08;
      }
      local_88.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state =
           (SharedPtrStateBase *)0x0;
    }
  }
  if (local_18.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_18.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_18.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr
           = (Expr<float> *)0x0;
      (*(local_18.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
      pSVar4 = extraout_RDX_09;
    }
    LOCK();
    pdVar1 = &(local_18.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_18.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state != (SharedPtrStateBase *)0x0) {
        (*(local_18.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state)->_vptr_SharedPtrStateBase[1])();
        pSVar4 = extraout_RDX_10;
      }
      local_18.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_48.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_48.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_48.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr
           = (Expr<float> *)0x0;
      (*(local_48.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
      pSVar4 = extraout_RDX_11;
    }
    LOCK();
    pdVar1 = &(local_48.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_48.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state != (SharedPtrStateBase *)0x0) {
        (*(local_48.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state)->_vptr_SharedPtrStateBase[1])();
        pSVar4 = extraout_RDX_12;
      }
      local_48.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_58.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_58.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)
              ->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_58.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_ptr =
           (Expr<tcu::Matrix<float,_2,_2>_> *)0x0;
      (*(local_58.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
      pSVar4 = extraout_RDX_13;
    }
    LOCK();
    pdVar1 = &(local_58.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)
              ->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_58.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
          super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state !=
          (SharedPtrStateBase *)0x0) {
        (*(local_58.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)->
          _vptr_SharedPtrStateBase[1])();
        pSVar4 = extraout_RDX_14;
      }
      local_58.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state =
           (SharedPtrStateBase *)0x0;
    }
  }
  if (local_28.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_28.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_28.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr
           = (Expr<float> *)0x0;
      (*(local_28.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
      pSVar4 = extraout_RDX_15;
    }
    LOCK();
    pdVar1 = &(local_28.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_28.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state != (SharedPtrStateBase *)0x0) {
        (*(local_28.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state)->_vptr_SharedPtrStateBase[1])();
        pSVar4 = extraout_RDX_16;
      }
      local_28.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_38.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_38.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)
              ->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_38.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_ptr =
           (Expr<tcu::Matrix<float,_2,_2>_> *)0x0;
      (*(local_38.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
      pSVar4 = extraout_RDX_17;
    }
    LOCK();
    pdVar1 = &(local_38.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)
              ->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_38.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
          super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state !=
          (SharedPtrStateBase *)0x0) {
        (*(local_38.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)->
          _vptr_SharedPtrStateBase[1])();
        pSVar4 = extraout_RDX_18;
      }
      local_38.super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state =
           (SharedPtrStateBase *)0x0;
    }
  }
  if (local_b0 != (long *)0x0) {
    LOCK();
    plVar2 = local_b0 + 1;
    *(int *)plVar2 = (int)*plVar2 + -1;
    UNLOCK();
    if ((int)*plVar2 == 0) {
      local_b8 = 0;
      (**(code **)(*local_b0 + 0x10))();
      pSVar4 = extraout_RDX_19;
    }
    LOCK();
    piVar3 = (int *)((long)local_b0 + 0xc);
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if ((*piVar3 == 0) && (local_b0 != (long *)0x0)) {
      (**(code **)(*local_b0 + 8))();
      pSVar4 = extraout_RDX_20;
    }
  }
  EVar5.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state =
       pSVar4;
  EVar5.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr =
       (Expr<float> *)this;
  return (ExprP<float>)
         EVar5.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>;
}

Assistant:

ExprP<Ret>	doExpand (ExpandContext&, const ArgExprs& args)	const
	{
		ExprP<Mat2>	mat	= args.a;

		return mat[0][0] * mat[1][1] - mat[1][0] * mat[0][1];
	}